

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
::run_impl(QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
           *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  bool bVar1;
  QueueTesterFlags QVar2;
  size_type sVar3;
  size_type sVar4;
  uint64_t uVar5;
  reference pvVar6;
  IncrementalStats *pIVar7;
  atomic<unsigned_long> *paVar8;
  LineUpdaterStreamAdapter *pLVar9;
  reference this_00;
  const_iterator cVar10;
  const_iterator cVar11;
  reference pPVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  unsigned_long local_968;
  bool local_959;
  bool local_909;
  PutTypeCounters *counter;
  iterator __end0_2;
  iterator __begin0_2;
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
  *__range2_1;
  long local_8b8;
  long spawned;
  FinalStats *thread_state;
  size_t thread_index_2;
  FinalStats final_state;
  histogram<long,_true> histogram_except_cons;
  histogram<long,_true> histogram_except_puts;
  histogram<long,_true> histogram_spawned;
  ThreadData *thread_1;
  iterator __end0_1;
  iterator __begin0_1;
  aligned_vector<ThreadData>_conflict1 *__range2;
  duration<long,_std::ratio<1L,_1000L>_> local_370;
  unsigned_long local_368;
  size_t enqueued;
  double enqueued_ratio;
  reference pTStack_350;
  bool too_many_enqueued;
  ThreadData *thread;
  iterator __end0;
  iterator __begin0;
  aligned_vector<ThreadData>_conflict1 *__range4;
  size_t active_threads;
  size_t consumed;
  size_t produced;
  Progress progress;
  undefined1 local_2f0 [7];
  bool complete;
  LineUpdaterStreamAdapter line;
  bool concurrent_consumes;
  ulong uStack_140;
  bool concurrent_puts;
  size_t thread_consume_count;
  size_t thread_put_count;
  uint64_t thread_affinity;
  size_t thread_index_1;
  bool reserve_core1_to_main;
  uint64_t num_of_processors;
  ulong local_108;
  size_t thread_index;
  atomic<bool> local_e9;
  undefined1 local_e8 [7];
  FeedBack feedback;
  aligned_vector<ThreadData>_conflict1 threads;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue;
  bool with_exceptions;
  size_type case_count;
  size_t i_target_put_count_local;
  EasyRandom *i_random_local;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
  *pQStack_40;
  QueueTesterFlags i_flags_local;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *this_local;
  memory_order local_30;
  int local_2c;
  memory_order __b_1;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  i_random_local._4_4_ = i_flags;
  pQStack_40 = this;
  sVar3 = std::
          unordered_map<density::runtime_type<>,_unsigned_long,_std::hash<density::runtime_type<>_>,_std::equal_to<density::runtime_type<>_>,_std::allocator<std::pair<const_density::runtime_type<>,_unsigned_long>_>_>
          ::size((unordered_map<density::runtime_type<>,_unsigned_long,_std::hash<density::runtime_type<>_>,_std::equal_to<density::runtime_type<>_>,_std::allocator<std::pair<const_density::runtime_type<>,_unsigned_long>_>_>
                  *)(this + 8));
  sVar4 = std::
          vector<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&)>_>
          ::size((vector<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&)>_>
                  *)(this + 0x40));
  if ((((sVar4 != sVar3) ||
       (sVar4 = std::
                vector<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::consume_operation_&),_std::allocator<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::consume_operation_&)>_>
                ::size((vector<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::consume_operation_&),_std::allocator<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::consume_operation_&)>_>
                        *)(this + 0x58)), sVar4 != sVar3)) ||
      (sVar4 = std::
               vector<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_put_transaction<void>_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_put_transaction<void>_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&)>_>
               ::size((vector<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_put_transaction<void>_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_put_transaction<void>_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&)>_>
                       *)(this + 0x70)), sVar4 != sVar3)) ||
     (sVar4 = std::
              vector<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_consume_operation_&)>_>
              ::size((vector<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::reentrant_consume_operation_&)>_>
                      *)(this + 0x88)), sVar4 != sVar3)) {
    detail::assert_failed<>
              ("m_put_cases.size() == case_count && m_consume_cases.size() == case_count && m_reentrant_put_cases.size() == case_count && m_reentrant_consume_cases.size() == case_count"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x75);
  }
  QVar2 = operator&(i_random_local._4_4_,eTestExceptions);
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
  conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                    *)&threads.
                       super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ::vector((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
            *)local_e8);
  FeedBack::FeedBack((FeedBack *)&local_e9);
  std::
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ::reserve((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             *)local_e8,*(size_type *)(this + 0xa0));
  for (local_108 = 0; local_108 < *(ulong *)(this + 0xa0); local_108 = local_108 + 1) {
    num_of_processors = (uint64_t)&local_e9;
    std::
    vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData>>
    ::
    emplace_back<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>const&,density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::FeedBack*,density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>&,density_tests::EasyRandom&,density_tests::QueueTesterFlags&>
              ((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData>>
                *)local_e8,
               (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
                *)this,(FeedBack **)&num_of_processors,
               (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *)&threads.
                   super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,i_random,
               (QueueTesterFlags *)((long)&i_random_local + 4));
  }
  uVar5 = get_num_of_processors();
  local_909 = operator&&(i_random_local._4_4_,eReserveCoreToMainThread);
  local_909 = local_909 && 3 < uVar5;
  for (thread_affinity = 0; thread_affinity < *(ulong *)(this + 0xa0);
      thread_affinity = thread_affinity + 1) {
    thread_put_count = std::numeric_limits<unsigned_long>::max();
    if (local_909) {
      thread_put_count = thread_put_count - 2;
    }
    line.m_prev_line_len._7_1_ = 1;
    line.m_prev_line_len._6_1_ = 1;
    thread_consume_count = i_target_put_count / *(ulong *)(this + 0xa0);
    if (thread_affinity == 0) {
      thread_consume_count = i_target_put_count % *(ulong *)(this + 0xa0) + thread_consume_count;
    }
    uStack_140 = i_target_put_count / *(ulong *)(this + 0xa0);
    if (thread_affinity == 0) {
      uStack_140 = i_target_put_count % *(ulong *)(this + 0xa0) + uStack_140;
    }
    if (uVar5 < 2) {
      thread_put_count = std::numeric_limits<unsigned_long>::max();
    }
    pvVar6 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             ::operator[]((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                           *)local_e8,thread_affinity);
    ThreadData::start((ThreadData *)pvVar6,thread_affinity,thread_consume_count,uStack_140,
                      thread_put_count);
  }
  LineUpdaterStreamAdapter::LineUpdaterStreamAdapter
            ((LineUpdaterStreamAdapter *)local_2f0,*(ostream **)this);
  progress.m_start_time.__d.__r._7_1_ = 0;
  Progress::Progress((Progress *)&produced,i_target_put_count);
  while (((progress.m_start_time.__d.__r._7_1_ ^ 0xff) & 1) != 0) {
    consumed = 0;
    active_threads = 0;
    __range4 = (aligned_vector<ThreadData>_conflict1 *)0x0;
    __end0 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             ::begin((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                      *)local_e8);
    thread = (ThreadData *)
             std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             ::end((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                    *)local_e8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>_>
                                       *)&thread), bVar1) {
      pTStack_350 = __gnu_cxx::
                    __normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>_>
                    ::operator*(&__end0);
      pIVar7 = ThreadData::incremental_stats((ThreadData *)pTStack_350);
      local_14 = 5;
      ___b = pIVar7;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_14 - 1U < 2) {
        local_20 = (pIVar7->m_produced).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_14 == 5) {
        local_20 = (pIVar7->m_produced).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        local_20 = (pIVar7->m_produced).super___atomic_base<unsigned_long>._M_i;
      }
      consumed = consumed + local_20;
      pIVar7 = ThreadData::incremental_stats((ThreadData *)pTStack_350);
      paVar8 = &pIVar7->m_consumed;
      local_2c = 5;
      ___b_1 = paVar8;
      local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_2c - 1U < 2) {
        this_local = (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
                      *)(paVar8->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_2c == 5) {
        this_local = (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
                      *)(paVar8->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        this_local = (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
                      *)(paVar8->super___atomic_base<unsigned_long>)._M_i;
      }
      active_threads = (long)&this_local->m_output + active_threads;
      pIVar7 = ThreadData::incremental_stats((ThreadData *)pTStack_350);
      bVar1 = std::atomic<bool>::load(&pIVar7->m_thread_is_active,memory_order_seq_cst);
      __range4 = (aligned_vector<ThreadData>_conflict1 *)
                 ((long)&(__range4->
                         super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)(int)(uint)bVar1);
      __gnu_cxx::
      __normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>_>
      ::operator++(&__end0);
    }
    if ((i_target_put_count < active_threads) || (i_target_put_count < consumed)) {
      detail::assert_failed<>
                ("consumed <= i_target_put_count && produced <= i_target_put_count",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0xd7);
    }
    local_959 = i_target_put_count <= active_threads && i_target_put_count <= consumed;
    progress.m_start_time.__d.__r._7_1_ = local_959;
    enqueued_ratio._7_1_ = false;
    if (active_threads < consumed) {
      lVar13 = consumed - active_threads;
      auVar14._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar14._0_8_ = lVar13;
      auVar14._12_4_ = 0x45300000;
      auVar15._8_4_ = (int)(active_threads >> 0x20);
      auVar15._0_8_ = active_threads;
      auVar15._12_4_ = 0x45300000;
      enqueued = (size_t)(((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                         ((auVar15._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)active_threads) - 4503599627370496.0)));
      enqueued_ratio._7_1_ = 0.2 < (double)enqueued;
    }
    std::atomic<bool>::store(&local_e9,(bool)enqueued_ratio._7_1_,memory_order_relaxed);
    bVar1 = operator&&(i_random_local._4_4_,ePrintProgress);
    if (bVar1) {
      if (consumed < active_threads) {
        local_968 = 0;
      }
      else {
        local_968 = consumed - active_threads;
      }
      local_368 = local_968;
      Progress::set_progress((Progress *)&produced,active_threads);
      pLVar9 = LineUpdaterStreamAdapter::operator<<
                         ((LineUpdaterStreamAdapter *)local_2f0,(char (*) [17])"Active threads: ");
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,(unsigned_long *)&__range4);
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,(char (*) [13])", Consumed: ");
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,&active_threads);
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,(char (*) [3])" (");
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,(Progress *)&produced);
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,(char (*) [14])"), enqueued: ");
      pLVar9 = LineUpdaterStreamAdapter::operator<<(pLVar9,&local_368);
      LineUpdaterStreamAdapter::operator<<(pLVar9,std::endl<char,std::char_traits<char>>);
    }
    if ((progress.m_start_time.__d.__r._7_1_ & 1) == 0) {
      __range2._4_4_ = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_370,(int *)((long)&__range2 + 4));
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_370);
    }
  }
  LineUpdaterStreamAdapter::~LineUpdaterStreamAdapter((LineUpdaterStreamAdapter *)local_2f0);
  __end0_1 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             ::begin((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                      *)local_e8);
  thread_1 = (ThreadData *)
             std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             ::end((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                    *)local_e8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>_>
                             *)&thread_1), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>_>
              ::operator*(&__end0_1);
    ThreadData::join((ThreadData *)this_00);
    __gnu_cxx::
    __normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>_>
    ::operator++(&__end0_1);
  }
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)&histogram_except_puts.m_row_length,"spawned by i-th thread",
             0x19,8);
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)&histogram_except_cons.m_row_length,"exceptions_during_puts",
             0x19,8);
  histogram<long,_true>::histogram
            ((histogram<long,_true> *)&final_state.m_exceptions_during_consumes,
             "exceptions_during_consumes",0x19,8);
  sVar4 = std::
          vector<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&)>_>
          ::size((vector<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_&,_density_tests::EasyRandom_&)>_>
                  *)(this + 0x40));
  FinalStats::FinalStats((FinalStats *)&thread_index_2,sVar4);
  for (thread_state = (FinalStats *)0x0; thread_state < *(FinalStats **)(this + 0xa0);
      thread_state = (FinalStats *)
                     ((long)&(thread_state->m_counters).
                             super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar6 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             ::operator[]((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                           *)local_e8,(size_type)thread_state);
    spawned = (long)ThreadData::final_stats((ThreadData *)pvVar6);
    FinalStats::operator+=((FinalStats *)&thread_index_2,(FinalStats *)spawned);
    cVar10 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
             ::begin((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
                      *)spawned);
    cVar11 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
             ::end((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
                    *)spawned);
    local_8b8 = std::
                accumulate<__gnu_cxx::__normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::PutTypeCounters_const*,std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::PutTypeCounters,std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::PutTypeCounters>>>,long,density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::run_impl(density_tests::QueueTesterFlags,density_tests::EasyRandom&,unsigned_long)const::_lambda(long,density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::PutTypeCounters_const&)_1_>
                          (cVar10._M_current,cVar11._M_current,0);
    histogram<long,_true>::operator<<
              ((histogram<long,_true> *)&histogram_except_puts.m_row_length,&local_8b8);
    if (QVar2 != eNone) {
      histogram<long,_true>::operator<<
                ((histogram<long,_true> *)&histogram_except_cons.m_row_length,
                 (long *)(spawned + 0x18));
      histogram<long,_true>::operator<<
                ((histogram<long,_true> *)&final_state.m_exceptions_during_consumes,
                 (long *)(spawned + 0x20));
    }
  }
  __end0_2 = std::
             vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
             ::begin((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
                      *)&thread_index_2);
  counter = (PutTypeCounters *)
            std::
            vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
            ::end((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
                   *)&thread_index_2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_2,
                            (__normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>_>
                             *)&counter), bVar1) {
    pPVar12 = __gnu_cxx::
              __normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>_>
              ::operator*(&__end0_2);
    if (pPVar12->m_existing != 0) {
      detail::assert_failed<>
                ("counter.m_existing == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0x114);
    }
    __gnu_cxx::
    __normal_iterator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters_*,_std::vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>_>
    ::operator++(&__end0_2);
  }
  density_tests::operator<<
            (*(ostream **)this,(histogram<long,_true> *)&histogram_except_puts.m_row_length);
  if (QVar2 != eNone) {
    density_tests::operator<<
              (*(ostream **)this,(histogram<long,_true> *)&histogram_except_cons.m_row_length);
    density_tests::operator<<
              (*(ostream **)this,(histogram<long,_true> *)&final_state.m_exceptions_during_consumes)
    ;
  }
  FinalStats::~FinalStats((FinalStats *)&thread_index_2);
  histogram<long,_true>::~histogram
            ((histogram<long,_true> *)&final_state.m_exceptions_during_consumes);
  histogram<long,_true>::~histogram((histogram<long,_true> *)&histogram_except_cons.m_row_length);
  histogram<long,_true>::~histogram((histogram<long,_true> *)&histogram_except_puts.m_row_length);
  std::
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ::~vector((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
             *)local_e8);
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
  ~conc_heter_queue((conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                     *)&threads.
                        super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
          run_impl(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            auto const case_count = m_element_types.size();
            DENSITY_TEST_ASSERT(
              m_put_cases.size() == case_count && m_consume_cases.size() == case_count &&
              m_reentrant_put_cases.size() == case_count &&
              m_reentrant_consume_cases.size() == case_count);

            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            QUEUE queue;

            /* prepare the array of threads. The initialization of the random generator
                may take some time, so we do it before starting the threads. */
            aligned_vector<ThreadData> threads;
            FeedBack                   feedback;
            threads.reserve(m_thread_count);
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                threads.emplace_back(*this, &feedback, queue, i_random, i_flags);
            }

            uint64_t const num_of_processors = get_num_of_processors();
            bool const     reserve_core1_to_main =
              (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;

            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                uint64_t thread_affinity  = std::numeric_limits<uint64_t>::max();
                size_t   thread_put_count = 0, thread_consume_count = 0;

                if (reserve_core1_to_main)
                    thread_affinity -= 2;

                auto concurrent_puts     = QUEUE::concurrent_puts;
                auto concurrent_consumes = QUEUE::concurrent_consumes;

                if (concurrent_puts)
                {
                    // distribute the puts to the threads - the first thread gets the remainder
                    thread_put_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_put_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow puts only to the first thread, and reserve the first core to it
                    if (thread_index == 0)
                    {
                        thread_put_count = i_target_put_count;
                        thread_affinity  = 1;
                    }
                    else
                    {
                        thread_affinity ^= 1;
                    }
                }

                if (concurrent_consumes)
                {
                    // distribute the consumes to the threads - the first thread gets the remainder
                    thread_consume_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_consume_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow consumes only to the first thread, and reserve the last core to it
                    if (thread_index == m_thread_count - 1)
                    {
                        thread_consume_count = i_target_put_count;
                        thread_affinity      = uint64_t(1) << (num_of_processors - 1);
                    }
                    else
                    {
                        thread_affinity ^= uint64_t(1) << (num_of_processors - 1);
                    }
                }

                if (num_of_processors <= 1)
                    thread_affinity = std::numeric_limits<uint64_t>::max();

                threads[thread_index].start(
                  thread_index, thread_put_count, thread_consume_count, thread_affinity);
            }

            // wait for the test to be completed
            {
                LineUpdaterStreamAdapter line(m_output);
                bool                     complete = false;
                Progress                 progress(i_target_put_count);
                while (!complete)
                {
                    size_t produced = 0, consumed = 0;
                    size_t active_threads = 0;
                    for (auto & thread : threads)
                    {
                        produced += thread.incremental_stats().m_produced.load();
                        consumed += thread.incremental_stats().m_consumed.load();
                        active_threads +=
                          thread.incremental_stats().m_thread_is_active.load() ? 1 : 0;
                    }
                    DENSITY_TEST_ASSERT(
                      consumed <= i_target_put_count && produced <= i_target_put_count);
                    complete = consumed >= i_target_put_count && produced >= i_target_put_count;

                    bool too_many_enqueued = false;
                    if (produced > consumed)
                    {
                        double const enqueued_ratio =
                          static_cast<double>(produced - consumed) / static_cast<double>(consumed);
                        too_many_enqueued = enqueued_ratio > 0.2;
                    }
                    feedback.m_too_many_enqueued.store(
                      too_many_enqueued, std::memory_order_relaxed);

                    if (i_flags && QueueTesterFlags::ePrintProgress)
                    {
                        auto const enqueued = produced >= consumed ? (produced - consumed) : 0;
                        progress.set_progress(consumed);
                        line << "Active threads: " << active_threads << ", Consumed: " << consumed
                             << " (" << progress << "), enqueued: " << enqueued << std::endl;
                    }

                    if (!complete)
                    {
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    }
                }
            }

            for (auto & thread : threads)
            {
                thread.join();
            }

            histogram<int64_t> histogram_spawned("spawned by i-th thread");
            histogram<int64_t> histogram_except_puts("exceptions_during_puts");
            histogram<int64_t> histogram_except_cons("exceptions_during_consumes");

            FinalStats final_state(m_put_cases.size());
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                auto const & thread_state = threads[thread_index].final_stats();
                final_state += thread_state;

                auto const spawned = std::accumulate(
                  thread_state.m_counters.begin(),
                  thread_state.m_counters.end(),
                  static_cast<int64_t>(0),
                  [](int64_t i_sum, const PutTypeCounters & i_counter) {
                      return i_sum + i_counter.m_spawned;
                  });
                histogram_spawned << spawned;

                if (with_exceptions)
                {
                    histogram_except_puts << thread_state.m_exceptions_during_puts;
                    histogram_except_cons << thread_state.m_exceptions_during_consumes;
                }
            }

            for (auto const & counter : final_state.m_counters)
            {
                DENSITY_TEST_ASSERT(counter.m_existing == 0);
            }

            m_output << histogram_spawned;
            if (with_exceptions)
            {
                m_output << histogram_except_puts;
                m_output << histogram_except_cons;
            }
        }